

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O1

atom * arc::make_sym(atom *__return_storage_ptr__,string *s)

{
  pointer pcVar1;
  variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  pbVar2;
  iterator iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  variant_alternative_t<2UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *ppbVar5;
  mapped_type *ppbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Move_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Copy_ctor_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
           .
           super__Variant_storage_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
   + 0x10) = '\0';
  __return_storage_ptr__->type = T_SYM;
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)id_of_sym_abi_cxx11_,s);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)pbVar4,pcVar1,pcVar1 + s->_M_string_length);
    local_20 = pbVar4;
    std::
    variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
    ::operator=((variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                 *)&__return_storage_ptr__->val,&local_20);
    ppbVar5 = std::
              get<2ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                        (&__return_storage_ptr__->val);
    pbVar2 = *ppbVar5;
    ppbVar6 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)id_of_sym_abi_cxx11_,s);
    *ppbVar6 = pbVar2;
  }
  else {
    std::
    variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
    ::operator=((variant<std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                 *)&__return_storage_ptr__->val,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_true>
                       ._M_cur + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

atom make_sym(const string& s)
	{
		atom a;
		a.type = T_SYM;

		auto found = id_of_sym.find(s);
		if (found != id_of_sym.end()) {
			a.val = found->second;
			return a;
		}

		a.val = new string(s);
		id_of_sym[s] = get<sym>(a.val);
		return a;
	}